

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_persistence_representations.h
# Opt level: O0

double Gudhi::Persistence_representations::find_zero_of_a_line_segment_between_those_two_points
                 (pair<double,_double> p1,pair<double,_double> p2)

{
  ostream *poVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double b;
  double a;
  char *err;
  string errMessageStr;
  ostringstream local_1a8 [8];
  ostringstream errMessage;
  pair<double,_double> p2_local;
  pair<double,_double> p1_local;
  
  dVar6 = p2.second;
  dVar4 = p2.first;
  dVar5 = p1.second;
  p1_local.second = p1.first;
  if ((p1_local.second != dVar4) || (NAN(p1_local.second) || NAN(dVar4))) {
    if (0.0 < dVar5 * dVar6) {
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      poVar1 = std::operator<<((ostream *)local_1a8,
                               "In function find_zero_of_a_line_segment_between_those_two_points the arguments are: ("
                              );
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,p1_local.second);
      poVar1 = std::operator<<(poVar1,",");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar5);
      poVar1 = std::operator<<(poVar1,") and (");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar4);
      poVar1 = std::operator<<(poVar1,",");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar6);
      std::operator<<(poVar1,
                      "). There is no zero in line between those two points. Program terminated.");
      std::__cxx11::ostringstream::str();
      uVar2 = std::__cxx11::string::c_str();
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = uVar2;
      __cxa_throw(puVar3,&char_const*::typeinfo,0);
    }
    dVar4 = (dVar6 - dVar5) / (dVar4 - p1_local.second);
    p1_local.second = -(-dVar4 * p1_local.second + dVar5) / dVar4;
  }
  return p1_local.second;
}

Assistant:

double find_zero_of_a_line_segment_between_those_two_points(std::pair<double, double> p1,
                                                            std::pair<double, double> p2) {
  if (p1.first == p2.first) return p1.first;
  if (p1.second * p2.second > 0) {
    std::ostringstream errMessage;
    errMessage << "In function find_zero_of_a_line_segment_between_those_two_points the arguments are: (" << p1.first
               << "," << p1.second << ") and (" << p2.first << "," << p2.second
               << "). There is no zero in line between those two points. Program terminated.";
    std::string errMessageStr = errMessage.str();
    const char* err = errMessageStr.c_str();
    throw(err);
  }
  // we assume here, that x \in [ p1.first, p2.first ] and p1 and p2 are points between which we will put the line
  // segment
  double a = (p2.second - p1.second) / (p2.first - p1.first);
  double b = p1.second - a * p1.first;
  return -b / a;
}